

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O2

bool __thiscall
StringKMerFactory::create_kmers
          (StringKMerFactory *this,string *s,
          vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
          *mers)

{
  uint64_t *rkmer;
  uint64_t *fkmer;
  uint64_t *__args_1;
  ulong uVar1;
  bool *__args;
  bool local_3a;
  bool local_39;
  vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>> *local_38;
  
  rkmer = &(this->super_KMerFactory).fkmer;
  fkmer = &(this->super_KMerFactory).rkmer;
  (this->super_KMerFactory).rkmer = 0;
  (this->super_KMerFactory).last_unknown = 0;
  (this->super_KMerFactory).fkmer = 0;
  local_38 = (vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>> *)
             mers;
  std::vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  reserve(mers,((long)(mers->
                      super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(mers->
                      super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) + s->_M_string_length);
  for (uVar1 = 0; uVar1 < s->_M_string_length; uVar1 = uVar1 + 1) {
    KMerFactory::fillKBuf
              (&this->super_KMerFactory,(s->_M_dataplus)._M_p[uVar1],rkmer,fkmer,
               &(this->super_KMerFactory).last_unknown);
    if ((long)(ulong)(this->super_KMerFactory).K <= (this->super_KMerFactory).last_unknown) {
      if (*fkmer < *rkmer) {
        local_3a = false;
        __args = &local_3a;
        __args_1 = fkmer;
      }
      else {
        local_39 = true;
        __args = &local_39;
        __args_1 = rkmer;
      }
      std::vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>::
      emplace_back<bool,unsigned_long&>(local_38,__args,__args_1);
    }
  }
  return false;
}

Assistant:

const bool create_kmers(const std::string &s, std::vector<std::pair<bool, uint64_t>> &mers) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        mers.reserve(mers.size()+s.size());
        while (p < s.size()) {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(true, fkmer);
                } else {
                    // Is bwd
                    mers.emplace_back(false, rkmer);
                }
            }
        }
        return false;
    }